

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O2

size_t jessilib::find<char16_t,char8_t,true>
                 (basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string,
                 basic_string_view<char8_t,_std::char_traits<char8_t>_> in_substring)

{
  size_t sVar1;
  char8_t *pcVar2;
  jessilib *pjVar3;
  char8_t *pcVar5;
  char16_t *pcVar6;
  jessilib *this;
  char8_t *pcVar7;
  jessilib *this_00;
  jessilib *this_01;
  decode_result dVar8;
  decode_result dVar9;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_01;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_02;
  jessilib *pjVar4;
  
  in_string_00._M_len = in_string._M_str;
  this = (jessilib *)in_string._M_len;
  pjVar3 = (jessilib *)in_substring._M_len;
  if (pjVar3 == (jessilib *)0x0) {
    pcVar2 = (char8_t *)0x0;
  }
  else {
    pcVar2 = (char8_t *)0xffffffffffffffff;
    if (this != (jessilib *)0x0) {
      if (pjVar3 == (jessilib *)0x1) {
        in_string_00._M_str._0_1_ = *in_substring._M_str;
        in_string_00._M_str._1_7_ = 0;
        sVar1 = find<char16_t,true>(this,in_string_00,(char32_t)in_substring._M_str);
        return sVar1;
      }
      pcVar7 = (char8_t *)0x0;
      for (; pcVar2 = (char8_t *)0xffffffffffffffff, pjVar4 = pjVar3, pcVar5 = in_substring._M_str,
          pcVar6 = in_string_00._M_len, this_00 = this, this_01 = pjVar3, this != (jessilib *)0x0;
          this = this + -(long)in_string_02._M_str) {
        do {
          in_string_01._M_str = (char16_t *)pjVar4;
          in_string_01._M_len = (size_t)pcVar6;
          dVar8 = decode_codepoint_utf16<char16_t>(this_00,in_string_01);
          in_string_02._M_str = (char8_t *)dVar8.units;
          in_string_02._M_len = (size_t)pcVar5;
          dVar9 = decode_codepoint_utf8<char8_t>(this_01,in_string_02);
          pjVar4 = (jessilib *)dVar9.units;
          if ((in_string_02._M_str == (char8_t *)0x0) || (pjVar4 == (jessilib *)0x0)) {
            return (size_t)(char8_t *)0xffffffffffffffff;
          }
          if (dVar8.codepoint != dVar9.codepoint) break;
          if (this_01 + -(long)pjVar4 == (jessilib *)0x0) {
            return (size_t)pcVar7;
          }
          this_00 = this_00 + -(long)in_string_02._M_str;
          pcVar5 = pcVar5 + (long)pjVar4;
          pcVar6 = pcVar6 + (long)in_string_02._M_str;
          this_01 = this_01 + -(long)pjVar4;
        } while (this_00 != (jessilib *)0x0);
        in_string_00._M_len = in_string_00._M_len + (long)in_string_02._M_str;
        pcVar7 = pcVar7 + (long)in_string_02._M_str;
      }
    }
  }
  return (size_t)pcVar2;
}

Assistant:

std::pair<bool, std::string> ustring_to_mbstring(std::basic_string_view<CharT> in_string) {
	std::pair<bool, std::string> result;

	std::mbstate_t mbstate{};
	decode_result decode;
	while ((decode = decode_codepoint(in_string)).units != 0) {
		in_string.remove_prefix(decode.units);

		char buffer[MB_LEN_MAX]; // MB_LEN_MAX is constant, MB_CUR_MAX is not, and C++ doesn't have VLAs
		size_t bytes_written = std::c32rtomb(buffer, decode.codepoint, &mbstate);
		if (bytes_written > MB_LEN_MAX) {
			// Invalid codepoint; return
			result.first = false;
			return result;
		}

		result.second.append(buffer, bytes_written);
	}

	result.first = true;
	return result;
}